

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O0

void __thiscall n_e_s::core::Pipeline::append(Pipeline *this,Pipeline *pipeline)

{
  back_insert_iterator<std::deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>_>
  __result;
  const_iterator local_58;
  const_iterator local_38;
  Pipeline *local_18;
  Pipeline *pipeline_local;
  Pipeline *this_local;
  
  local_18 = pipeline;
  pipeline_local = this;
  std::
  deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ::begin(&local_38,&pipeline->steps_);
  std::
  deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ::end(&local_58,&local_18->steps_);
  __result = std::
             back_inserter<std::deque<std::function<n_e_s::core::StepResult()>,std::allocator<std::function<n_e_s::core::StepResult()>>>>
                       (&this->steps_);
  std::
  copy<std::_Deque_iterator<std::function<n_e_s::core::StepResult()>,std::function<n_e_s::core::StepResult()>const&,std::function<n_e_s::core::StepResult()>const*>,std::back_insert_iterator<std::deque<std::function<n_e_s::core::StepResult()>,std::allocator<std::function<n_e_s::core::StepResult()>>>>>
            (&local_38,&local_58,__result);
  return;
}

Assistant:

void Pipeline::append(const Pipeline &pipeline) {
    std::copy(pipeline.steps_.begin(),
            pipeline.steps_.end(),
            std::back_inserter(steps_));
}